

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::Write
          (TPZDohrSubstructCondense<double> *this,TPZStream *out,int withclassid)

{
  TPZReference *pTVar1;
  TPZMatRed<double,_TPZFMatrix<double>_> *pTVar2;
  TPZDohrSubstructCondense<double> *pTVar3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Self __tmp;
  int a;
  int one;
  int b;
  TPZDohrSubstructCondense<double> *local_48;
  int sc;
  int four;
  int three;
  int two;
  
  pTVar1 = (this->fMatRedComplete).fRef;
  if ((pTVar1 == (TPZReference *)0x0) ||
     (pTVar1->fPointer == (TPZMatRed<double,_TPZFMatrix<double>_> *)0x0)) {
    one = 0;
    (*out->_vptr_TPZStream[3])(out,&one,1);
  }
  else {
    one = 1;
    (*out->_vptr_TPZStream[3])(out,&one,1);
    pTVar2 = ((this->fMatRedComplete).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[5])
              (pTVar2,out,0);
  }
  (*out->_vptr_TPZStream[3])(out,&this->fNEquations,1);
  (*out->_vptr_TPZStream[3])(out,&this->fNumInternalEquations,1);
  (*out->_vptr_TPZStream[3])(out,&this->fNumExternalEquations,1);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,this->fNEquations);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->fNumInternalEquations);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->fNumExternalEquations);
  std::endl<char,std::char_traits<char>>(poVar4);
  TPZStream::Write<int>(out,&this->fCoarseNodes);
  poVar4 = ::operator<<((ostream *)&std::cout,&this->fCoarseNodes);
  std::endl<char,std::char_traits<char>>(poVar4);
  one = 1;
  two = 2;
  three = 3;
  four = 4;
  (*out->_vptr_TPZStream[3])(out,&one,1);
  TPZFMatrix<double>::Write(&this->fPhiC,out,0);
  (*out->_vptr_TPZStream[3])(out,&two,1);
  TPZFMatrix<double>::Write(&this->fPhiC_Weighted_Condensed,out,0);
  (*out->_vptr_TPZStream[3])(out,&three,1);
  TPZStream::Write<double>(out,&(this->fWeights).super_TPZVec<double>);
  TPZFMatrix<double>::Write(&this->fKCi,out,0);
  (*out->_vptr_TPZStream[3])(out,&four,1);
  sc = (int)(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  (*out->_vptr_TPZStream[3])(out,&sc,1);
  local_48 = this;
  for (p_Var5 = (this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pTVar3 = local_48,
      (_Rb_tree_header *)p_Var5 != &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    a = p_Var5[1]._M_color;
    b = *(int *)&p_Var5[1].field_0x4;
    (*out->_vptr_TPZStream[3])(out,&a,1);
    (*out->_vptr_TPZStream[3])(out,&b,1);
    TPZStream::Write<int>(out,(TPZVec<int> *)&p_Var5[1]._M_parent);
  }
  pTVar1 = (local_48->fMatRed).fRef;
  if ((pTVar1 == (TPZReference *)0x0) ||
     (pTVar1->fPointer == (TPZMatRed<double,_TPZFMatrix<double>_> *)0x0)) {
    a = 0;
    (*out->_vptr_TPZStream[3])(out,&a,1);
  }
  else {
    a = 1;
    (*out->_vptr_TPZStream[3])(out,&a,1);
    pTVar2 = ((pTVar3->fMatRed).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[5])
              (pTVar2,out,0);
  }
  TPZFMatrix<double>::Write(&pTVar3->fLocalLoad,out,0);
  TPZFMatrix<double>::Write(&pTVar3->fLocalWeightedResidual,out,0);
  TPZFMatrix<double>::Write(&pTVar3->fAdjustSolution,out,0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Write(TPZStream &out, int withclassid) const
{    
    SAVEABLE_STR_NOTE(out,"fMatRedComplete");
    if(fMatRedComplete)
    {
        int one = 1;
        out.Write(&one);
        fMatRedComplete->Write(out,0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    SAVEABLE_STR_NOTE(out,"fNEquations");
    out.Write(&fNEquations);
    SAVEABLE_STR_NOTE(out,"fNumInternalEquations");
    out.Write(&fNumInternalEquations);
    SAVEABLE_STR_NOTE(out,"fNumExternalEquations");
    out.Write(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    out.Write( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(1),two(2),three(3),four(4);
    
    out.Write(&one);
    fPhiC.Write(out, 0);
    out.Write(&two);
    fPhiC_Weighted_Condensed.Write(out, 0);
    out.Write(&three);
    out.Write( fWeights);
    fKCi.Write(out, 0);
    out.Write(&four);
    typename std::map<std::pair<ENumbering, ENumbering> , TPZVec<int> >::const_iterator it;
    int sc = fPermutationsScatter.size();
    out.Write(&sc);
    for (it=fPermutationsScatter.begin(); it != fPermutationsScatter.end(); it++) {
        int a = it->first.first;
        int b = it->first.second;
        out.Write(&a);
        out.Write(&b);
        out.Write( it->second);
    }
    if (fMatRed) {
        int one = 1;
        out.Write(&one);
        fMatRed->Write(out, 0);
    }
    else {
        int zero = 0;
        out.Write(&zero);
    }
    
    fLocalLoad.Write(out, 0);
    fLocalWeightedResidual.Write(out, 0);
    fAdjustSolution.Write(out, 0);

}